

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O3

void aom_calc_psnr(YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b,PSNR_STATS *psnr)

{
  int width;
  int height;
  int64_t iVar1;
  uint uVar2;
  long lVar3;
  uint64_t uVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int b_strides [3];
  int a_strides [3];
  int heights [3];
  int widths [3];
  int local_70 [12];
  YV12_BUFFER_CONFIG *local_40;
  YV12_BUFFER_CONFIG *local_38;
  
  local_70[9] = (a->field_2).field_0.y_crop_width;
  local_70[10] = (a->field_2).field_0.uv_crop_width;
  local_70[0xb] = local_70[10];
  local_70[6] = (a->field_3).field_0.y_crop_height;
  local_70[7] = (a->field_3).field_0.uv_crop_height;
  local_70[8] = local_70[7];
  local_70[3] = (a->field_4).field_0.y_stride;
  local_70[4] = (a->field_4).field_0.uv_stride;
  local_70[5] = local_70[4];
  local_70[0] = (b->field_4).field_0.y_stride;
  local_70[1] = (b->field_4).field_0.uv_stride;
  local_70[2] = local_70[1];
  lVar3 = 0;
  uVar4 = 0;
  uVar2 = 0;
  local_40 = a;
  local_38 = b;
  do {
    width = *(int *)((long)local_70 + lVar3 + 0x24);
    height = *(int *)((long)local_70 + lVar3 + 0x18);
    uVar5 = height * width;
    iVar1 = get_sse(*(uint8_t **)((long)local_40->store_buf_adr + lVar3 * 2 + -0x20),
                    *(int *)((long)local_70 + lVar3 + 0xc),
                    *(uint8_t **)((long)local_38->store_buf_adr + lVar3 * 2 + -0x20),
                    *(int *)((long)local_70 + lVar3),width,height);
    *(int64_t *)((long)psnr->sse + lVar3 * 2 + 8) = iVar1;
    *(uint *)((long)psnr->samples + lVar3 + 4) = uVar5;
    dVar7 = 100.0;
    if (iVar1 != 0) {
      auVar8._8_4_ = (int)((ulong)iVar1 >> 0x20);
      auVar8._0_8_ = iVar1;
      auVar8._12_4_ = 0x45300000;
      dVar6 = log10(((double)uVar5 * 255.0 * 255.0) /
                    ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0)));
      dVar7 = 100.0;
      if (dVar6 * 10.0 <= 100.0) {
        dVar7 = dVar6 * 10.0;
      }
    }
    *(double *)((long)psnr->psnr + lVar3 * 2 + 8) = dVar7;
    uVar4 = uVar4 + iVar1;
    uVar2 = uVar2 + uVar5;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  psnr->sse[0] = uVar4;
  psnr->samples[0] = uVar2;
  if (uVar4 == 0) {
    dVar7 = 100.0;
  }
  else {
    auVar9._8_4_ = (int)(uVar4 >> 0x20);
    auVar9._0_8_ = uVar4;
    auVar9._12_4_ = 0x45300000;
    dVar6 = log10(((double)uVar2 * 255.0 * 255.0) /
                  ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)));
    dVar7 = 100.0;
    if (dVar6 * 10.0 <= 100.0) {
      dVar7 = dVar6 * 10.0;
    }
  }
  psnr->psnr[0] = dVar7;
  return;
}

Assistant:

void aom_calc_psnr(const YV12_BUFFER_CONFIG *a, const YV12_BUFFER_CONFIG *b,
                   PSNR_STATS *psnr) {
  assert(a->y_crop_width == b->y_crop_width);
  assert(a->y_crop_height == b->y_crop_height);
  assert(a->uv_crop_width == b->uv_crop_width);
  assert(a->uv_crop_height == b->uv_crop_height);
  static const double peak = 255.0;
  const int widths[3] = { a->y_crop_width, a->uv_crop_width, a->uv_crop_width };
  const int heights[3] = { a->y_crop_height, a->uv_crop_height,
                           a->uv_crop_height };
  const int a_strides[3] = { a->y_stride, a->uv_stride, a->uv_stride };
  const int b_strides[3] = { b->y_stride, b->uv_stride, b->uv_stride };
  int i;
  uint64_t total_sse = 0;
  uint32_t total_samples = 0;

  for (i = 0; i < 3; ++i) {
    const int w = widths[i];
    const int h = heights[i];
    const uint32_t samples = w * h;
    const uint64_t sse =
        get_sse(a->buffers[i], a_strides[i], b->buffers[i], b_strides[i], w, h);
    psnr->sse[1 + i] = sse;
    psnr->samples[1 + i] = samples;
    psnr->psnr[1 + i] = aom_sse_to_psnr(samples, peak, (double)sse);

    total_sse += sse;
    total_samples += samples;
  }

  psnr->sse[0] = total_sse;
  psnr->samples[0] = total_samples;
  psnr->psnr[0] =
      aom_sse_to_psnr((double)total_samples, peak, (double)total_sse);
}